

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::SerializationException::SerializationException<unsigned_long,unsigned_long,unsigned_long>
          (SerializationException *this,string *msg,unsigned_long params,unsigned_long params_1,
          unsigned_long params_2)

{
  unsigned_long in_R9;
  string local_30;
  
  Exception::ConstructMessage<unsigned_long,unsigned_long,unsigned_long>
            (&local_30,(Exception *)msg,(string *)params,params_1,params_2,in_R9);
  SerializationException(this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit SerializationException(const string &msg, ARGS... params)
	    : SerializationException(ConstructMessage(msg, params...)) {
	}